

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

void uv__poll_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  int *piVar1;
  code *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  undefined8 uVar3;
  
  if ((events & 10) == 8) {
    uv__io_stop(loop,w,0x2007);
    uVar2 = w[-1].pevents;
    if (((uVar2 & 4) != 0) && (w[-1].pevents = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
      piVar1 = (int *)(*(long *)&w[-2].fd + 8);
      *piVar1 = *piVar1 + -1;
    }
    UNRECOVERED_JUMPTABLE = *(code **)&w[-1].fd;
    uVar3 = 0xfffffffffffffff7;
    uVar2 = 0;
  }
  else {
    uVar2 = events >> 0xb & 4 | events >> 1 & 2 | (events & 1) + (events & 2) * 4;
    UNRECOVERED_JUMPTABLE = *(code **)&w[-1].fd;
    uVar3 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(&w[-2].pevents,uVar3,uVar2);
  return;
}

Assistant:

static void uv__poll_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_poll_t* handle;
  int pevents;

  handle = container_of(w, uv_poll_t, io_watcher);

  /*
   * As documented in the kernel source fs/kernfs/file.c #780
   * poll will return POLLERR|POLLPRI in case of sysfs
   * polling. This does not happen in case of out-of-band
   * TCP messages.
   *
   * The above is the case on (at least) FreeBSD and Linux.
   *
   * So to properly determine a POLLPRI or a POLLERR we need
   * to check for both.
   */
  if ((events & POLLERR) && !(events & UV__POLLPRI)) {
    uv__io_stop(loop, w, POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);
    uv__handle_stop(handle);
    handle->poll_cb(handle, UV_EBADF, 0);
    return;
  }

  pevents = 0;
  if (events & POLLIN)
    pevents |= UV_READABLE;
  if (events & UV__POLLPRI)
    pevents |= UV_PRIORITIZED;
  if (events & POLLOUT)
    pevents |= UV_WRITABLE;
  if (events & UV__POLLRDHUP)
    pevents |= UV_DISCONNECT;

  handle->poll_cb(handle, 0, pevents);
}